

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V5_annotation.cpp
# Opt level: O0

bool __thiscall
ON_OBSOLETE_V2_AnnotationArrow::GetBBox
          (ON_OBSOLETE_V2_AnnotationArrow *this,double *boxmin,double *boxmax,bool bGrowBox)

{
  double *pdVar1;
  bool local_22;
  bool rc;
  bool bGrowBox_local;
  double *boxmax_local;
  double *boxmin_local;
  ON_OBSOLETE_V2_AnnotationArrow *this_local;
  
  pdVar1 = ON_3dPoint::operator_cast_to_double_(&this->m_tail);
  local_22 = ON_GetPointListBoundingBox(3,false,1,3,pdVar1,boxmin,boxmax,(uint)(-bGrowBox & 1));
  if (local_22) {
    pdVar1 = ON_3dPoint::operator_cast_to_double_(&this->m_head);
    local_22 = ON_GetPointListBoundingBox(3,false,1,3,pdVar1,boxmin,boxmax,1);
  }
  return local_22;
}

Assistant:

bool ON_OBSOLETE_V2_AnnotationArrow::GetBBox( double* boxmin, double* boxmax, bool bGrowBox ) const
{
  bool rc = ON_GetPointListBoundingBox( 3, false, 1, 3, m_tail, boxmin, boxmax, bGrowBox?true:false );
  if (rc)
    rc = ON_GetPointListBoundingBox( 3, false, 1, 3, m_head, boxmin, boxmax, true );
  return rc;
}